

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

bool CoreML::Specification::TreeEnsembleParameters_TreeNode_TreeNodeBehavior_IsValid(int value)

{
  return (uint)value < 7;
}

Assistant:

bool TreeEnsembleParameters_TreeNode_TreeNodeBehavior_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
      return true;
    default:
      return false;
  }
}